

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlst.cpp
# Opt level: O3

int CVmObjList::getp_join(vm_val_t *retval,vm_val_t *self_val,char *lst,uint *in_argc)

{
  int iVar1;
  size_t sep_len;
  ushort *puVar2;
  uint uVar3;
  
  if (in_argc == (uint *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *in_argc;
  }
  if (getp_join(vm_val_t*,vm_val_t_const*,char_const*,unsigned_int*)::desc == '\0') {
    getp_join();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,in_argc,&getp_join::desc);
  if (iVar1 == 0) {
    if (uVar3 == 0) {
      sep_len = 0;
      puVar2 = (ushort *)0x0;
    }
    else {
      sep_len = 0;
      puVar2 = (ushort *)0x0;
      if (sp_[-1].typ != VM_NIL) {
        puVar2 = (ushort *)vm_val_t::get_as_string(sp_ + -1);
        if (puVar2 == (ushort *)0x0) {
          err_throw(0x900);
        }
        sep_len = (size_t)*puVar2;
        puVar2 = puVar2 + 1;
      }
    }
    join(retval,self_val,(char *)puVar2,sep_len);
    sp_ = sp_ + -(long)(int)uVar3;
  }
  return 1;
}

Assistant:

int CVmObjList::getp_join(VMG_ vm_val_t *retval,
                          const vm_val_t *self_val,
                          const char *lst, uint *in_argc)
{
    /* check arguments */
    uint argc = (in_argc == 0 ? 0 : *in_argc);
    static CVmNativeCodeDesc desc(0, 1);
    if (get_prop_check_argc(retval, in_argc, &desc))
        return TRUE;

    /* make sure the 'separator' argument is valid */
    int sep_len = 0;
    const char *sep = 0;
    if (argc >= 1 && G_stk->get(0)->typ != VM_NIL)
    {
        /* it's there - make sure it's a string */
        if ((sep = G_stk->get(0)->get_as_string(vmg0_)) == 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* note its length, and get a pointer to its string bytes */
        sep_len = vmb_get_len(sep);
        sep += VMB_LEN;
    }

    /* do the join */
    join(vmg_ retval, self_val, sep, sep_len);

    /* discard arguments */
    G_stk->discard(argc);

    /* handled */
    return TRUE;
}